

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

int rtosc_count_printed_arg_vals(char *src)

{
  uint uVar1;
  ushort **ppuVar2;
  char **in_RDI;
  char *newsrc;
  char *recent_src;
  int skipped_now;
  int num;
  int in_stack_00000138;
  int in_stack_0000013c;
  char *in_stack_00000140;
  char *in_stack_00000148;
  int *in_stack_00000150;
  char *in_stack_00000158;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  char **in_stack_ffffffffffffffe0;
  char **src_00;
  char **local_8;
  
  skip_while(in_stack_ffffffffffffffe0,
             (_func_int_int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  while (local_8 = in_RDI, *(char *)in_RDI == '%') {
    skip_fmt(in_stack_ffffffffffffffe0,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  while( true ) {
    uVar1 = in_stack_ffffffffffffffdc & 0xffffff;
    if ((local_8 != (char **)0x0) &&
       (uVar1 = in_stack_ffffffffffffffdc & 0xffffff, *(char *)local_8 != '\0')) {
      uVar1 = CONCAT13(*(char *)local_8 != '/',(int3)in_stack_ffffffffffffffdc);
    }
    in_stack_ffffffffffffffdc = uVar1;
    if ((char)(in_stack_ffffffffffffffdc >> 0x18) == '\0') break;
    local_8 = (char **)rtosc_skip_next_printed_arg
                                 (in_stack_00000158,in_stack_00000150,in_stack_00000148,
                                  in_stack_00000140,in_stack_0000013c,in_stack_00000138);
    if (((local_8 != (char **)0x0) &&
        (src_00 = local_8,
        skip_while(local_8,(_func_int_int *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
        *(char *)local_8 != '\0')) &&
       (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*(char *)local_8] & 0x2000) == 0)) {
      while (*(char *)local_8 == '%') {
        skip_fmt(src_00,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
    }
  }
  return 0;
}

Assistant:

int rtosc_count_printed_arg_vals(const char* src)
{
    int num = 0;

    skip_while(&src, isspace);
    while (*src == '%')
        skip_fmt(&src, "%*[^\n] %n");

    int skipped_now = 0;
    const char* recent_src = NULL;
    for(; src && *src && *src != '/'; num += skipped_now)
    {
        const char* newsrc = rtosc_skip_next_printed_arg(src, &skipped_now,
                                                         NULL, recent_src, 1,
                                                         0);
        recent_src = src;
        src = newsrc;

        if(src) // no parse error
        {
            skip_while(&src, isspace);
            if(*src && !isspace(*src))
            {
                while (*src == '%')
                    skip_fmt(&src, "%*[^\n] %n");
            }
        }
    }
    return src ? num : -num;
}